

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void disas_cmp(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  int opsize;
  TCGContext_conflict2 *pTVar1;
  TCGv_i32 src;
  TCGv_i32 dest;
  
  pTVar1 = s->uc->tcg_ctx;
  opsize = *(int *)(&DAT_00d886a4 + (insn >> 4 & 0xc));
  src = gen_ea_mode(env,s,insn >> 3 & 7,insn & 7,opsize,pTVar1->NULL_QREG,(TCGv_i32 *)0x0,EA_LOADS,
                    (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  if (src != pTVar1->NULL_QREG) {
    dest = gen_extend(s,*(TCGv_i32 *)((long)pTVar1->cpu_dregs + (ulong)(insn >> 6 & 0x38)),opsize,1)
    ;
    gen_update_cc_cmp(s,dest,src,opsize);
    return;
  }
  gen_exception(s,(s->base).pc_next,3);
  return;
}

Assistant:

DISAS_INSN(cmp)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv src;
    TCGv reg;
    int opsize;

    opsize = insn_opsize(insn);
    SRC_EA(env, src, opsize, 1, NULL);
    reg = gen_extend(s, DREG(insn, 9), opsize, 1);
    gen_update_cc_cmp(s, reg, src, opsize);
}